

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

Matcher<const_char_*> * __thiscall
testing::PolymorphicMatcher::operator_cast_to_Matcher
          (Matcher<const_char_*> *__return_storage_ptr__,PolymorphicMatcher *this)

{
  MatcherInterface<const_char_*> *pMVar1;
  
  pMVar1 = (MatcherInterface<const_char_*> *)operator_new(0x30);
  (pMVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MonomorphicImpl_00186a88;
  pMVar1[1].super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)(pMVar1 + 3);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pMVar1 + 1),*(long *)this,*(long *)(this + 8) + *(long *)this);
  *(undefined2 *)&pMVar1[5].super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       *(undefined2 *)(this + 0x20);
  (__return_storage_ptr__->super_MatcherBase<const_char_*>).impl_.value_ = pMVar1;
  (__return_storage_ptr__->super_MatcherBase<const_char_*>).impl_.link_.next_ =
       &(__return_storage_ptr__->super_MatcherBase<const_char_*>).impl_.link_;
  (__return_storage_ptr__->super_MatcherBase<const_char_*>)._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_00186218;
  return __return_storage_ptr__;
}

Assistant:

operator Matcher<T>() const {
    return Matcher<T>(new MonomorphicImpl<T>(impl_));
  }